

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O2

void __thiscall Neuron_testApplyInTime_Test::TestBody(Neuron_testApplyInTime_Test *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *in_R9;
  uint uVar4;
  float fVar5;
  AssertionResult gtest_ar_;
  AssertHelper local_4d8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  string local_4c8;
  float local_4a4;
  Neuron n;
  ofstream fns;
  ofstream fn;
  
  std::ofstream::ofstream(&fn);
  std::ofstream::ofstream(&fns);
  std::ofstream::open((char *)&fn,0x13e389);
  std::ofstream::open((char *)&fns,0x13e397);
  Neuron::Neuron(&n,10.0,1.0,50.0);
  uVar4 = 0;
  do {
    if (uVar4 == 1000) {
      Neuron::~Neuron(&n);
      std::ofstream::~ofstream(&fns);
      std::ofstream::~ofstream(&fn);
      return;
    }
    local_4a4 = Neuron::mem(&n);
    poVar3 = (ostream *)std::ostream::operator<<(&fn,uVar4);
    poVar3 = std::operator<<(poVar3,"; ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4a4);
    poVar3 = std::operator<<(poVar3,"; ");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&fns,">");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    poVar3 = std::operator<<(poVar3," U=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4a4);
    poVar3 = std::operator<<(poVar3," I=");
    fVar5 = Neuron::syn(&n);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = Neuron::tick(&n,1.0);
    if (bVar1) {
      std::operator<<((ostream *)&fns,"\t\t\t****** spike\n");
    }
    if (uVar4 == 0x1cc) {
      bVar1 = Neuron::apply(&n,160.0,(Connection *)0x0);
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) goto LAB_001245a0;
      testing::Message::Message((Message *)&local_4d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(160)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_4d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                 ,0x92,local_4c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
LAB_00124586:
      testing::internal::AssertHelper::~AssertHelper(&local_4d8);
      std::__cxx11::string::~string((string *)&local_4c8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_4d0);
LAB_001245a0:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    else {
      if (uVar4 == 0x30) {
        fVar5 = Neuron::mem(&n);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = 0.0 < fVar5;
        if (fVar5 <= 0.0) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.mem() > 0","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x7a,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_00124586;
        }
        goto LAB_001245a0;
      }
      if (uVar4 == 0x31) {
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"fired","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x7d,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_00124586;
        }
        goto LAB_001245a0;
      }
      if (uVar4 == 100) {
        bVar2 = Neuron::apply(&n,80.0,(Connection *)0x0);
        gtest_ar_.success_ = !bVar2;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(80)","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x80,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
LAB_001244fe:
          testing::internal::AssertHelper::~AssertHelper(&local_4d8);
          std::__cxx11::string::~string((string *)&local_4c8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_4d0);
        }
LAB_00124518:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
LAB_00124522:
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"fired","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x95,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_00124586;
        }
        goto LAB_001245a0;
      }
      if (uVar4 == 200) {
        gtest_ar_.success_ = Neuron::apply(&n,50.0,(Connection *)0x0);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(50)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x83,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_001244fe;
        }
        goto LAB_00124518;
      }
      if (uVar4 == 0xe6) {
        gtest_ar_.success_ = Neuron::apply(&n,-50.0,(Connection *)0x0);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(-50)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x86,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_001244fe;
        }
        goto LAB_00124518;
      }
      if (uVar4 == 0x104) {
        gtest_ar_.success_ = Neuron::apply(&n,-50.0,(Connection *)0x0);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(-50)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x89,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_001244fe;
        }
        goto LAB_00124518;
      }
      if (uVar4 == 0x154) {
        gtest_ar_.success_ = Neuron::apply(&n,10.0,(Connection *)0x0);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(10)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x8c,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_001244fe;
        }
        goto LAB_00124518;
      }
      if (uVar4 == 400) {
        gtest_ar_.success_ = Neuron::apply(&n,160.0,(Connection *)0x0);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_4d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(160)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x8f,local_4c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
          goto LAB_001244fe;
        }
        goto LAB_00124518;
      }
      if (uVar4 != 10) {
        if (0x16b < uVar4 - 0x32) {
          if (uVar4 == 0x244) {
            gtest_ar_.success_ = Neuron::apply(&n,50.0,(Connection *)0x0);
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!gtest_ar_.success_) {
              testing::Message::Message((Message *)&local_4d0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"n.apply(50)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_4d8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                         ,0x98,local_4c8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
              goto LAB_00124586;
            }
          }
          else {
            if (uVar4 < 0x28b) goto LAB_001245aa;
            gtest_ar_.success_ = !bVar1;
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!gtest_ar_.success_) {
              testing::Message::Message((Message *)&local_4d0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_4c8,(internal *)&gtest_ar_,(AssertionResult *)"fired","true","false"
                         ,in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_4d8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                         ,0x9b,local_4c8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
              goto LAB_00124586;
            }
          }
          goto LAB_001245a0;
        }
        goto LAB_00124522;
      }
      Neuron::apply(&n,50.0,(Connection *)0x0);
    }
LAB_001245aa:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

TEST(Neuron, testApplyInTime)
{
    std::ofstream fn, fns;
    fn.open("testApply.csv");
    fns.open("testApply.txt");

    Neuron n(10, 1, 50);

    for (int t = 0; t < 1000; ++t) {
        float mem = n.mem();
        fn << t << "; " << mem << "; " << std::endl;
        fns << ">" << t << " U=" << mem << " I="<< n.syn() << std::endl;

        bool fired = n.tick(TIME_STEP);
        if (fired)
            fns << "\t\t\t****** spike\n";

        if (t == 10)
            n.apply(50);

        if (t == 48)
            EXPECT_TRUE(n.mem() > 0);

        if (t == 49)
            EXPECT_TRUE(fired);

        if (t == 100)
            EXPECT_FALSE(n.apply(80));

        if (t == 200)
            EXPECT_TRUE(n.apply(50));

        if (t == 230)
            EXPECT_TRUE(n.apply(-50));

        if (t == 260)
            EXPECT_TRUE(n.apply(-50));

        if (t == 340)
            EXPECT_TRUE(n.apply(10));

        if (t == 400)
            EXPECT_TRUE(n.apply(160));

        if (t == 460)
            EXPECT_FALSE(n.apply(160));

        if (t >=50 && t < 414)
            EXPECT_FALSE(fired);

        if (t == 580)
            EXPECT_TRUE(n.apply(50));

        if (t > 650)
            EXPECT_FALSE(fired);
    }
}